

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covMinUtil.c
# Opt level: O1

void Min_CoverExpand(Min_Man_t *p,Min_Cube_t *pCover)

{
  Min_Cube_t **ppMVar1;
  Min_Cube_t *pMVar2;
  Min_Cube_t *pMVar3;
  int iVar4;
  uint uVar5;
  
  Min_ManClean(p,p->nVars);
  if (pCover != (Min_Cube_t *)0x0) {
    iVar4 = p->nCubes;
    pMVar2 = pCover->pNext;
    while( true ) {
      pMVar3 = pMVar2;
      iVar4 = iVar4 + 1;
      ppMVar1 = p->ppStore;
      uVar5 = *(uint *)&pCover->field_0x8 >> 0x16;
      pCover->pNext = ppMVar1[uVar5];
      ppMVar1[uVar5] = pCover;
      p->nCubes = iVar4;
      if (pMVar3 == (Min_Cube_t *)0x0) break;
      pMVar2 = pMVar3->pNext;
      pCover = pMVar3;
    }
  }
  return;
}

Assistant:

void Min_CoverExpand( Min_Man_t * p, Min_Cube_t * pCover )
{
    Min_Cube_t * pCube, * pCube2;
    Min_ManClean( p, p->nVars );
    Min_CoverForEachCubeSafe( pCover, pCube, pCube2 )
    {
        pCube->pNext = p->ppStore[pCube->nLits];
        p->ppStore[pCube->nLits] = pCube;
        p->nCubes++;
    }
}